

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O3

int Extra_bddSuppCheckContainment
              (DdManager *dd,DdNode *bL,DdNode *bH,DdNode **bLarge,DdNode **bSmall)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  
  if (bL != bH) {
    pDVar6 = dd->one;
    bVar4 = true;
    bVar3 = true;
    pDVar5 = bL;
    pDVar7 = bH;
    do {
      if (pDVar7 == pDVar6 && pDVar5 == pDVar6) {
        if ((bool)(bVar4 & bVar3)) {
          __assert_fail("!fHcontainsL || !fLcontainsH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddMisc.c"
                        ,0x1fa,
                        "int Extra_bddSuppCheckContainment(DdManager *, DdNode *, DdNode *, DdNode **, DdNode **)"
                       );
        }
        pDVar6 = bL;
        if (!bVar3) {
          pDVar6 = bH;
          bH = bL;
        }
LAB_007b6c32:
        *bLarge = bH;
        *bSmall = pDVar6;
        return 1;
      }
      if (pDVar5 == pDVar6) {
        pDVar6 = bL;
        bH = bH;
        if (!bVar3) {
          return 0;
        }
        goto LAB_007b6c32;
      }
      if (pDVar7 == pDVar6) {
        pDVar6 = bH;
        bH = bL;
        if (!bVar4) {
          return 0;
        }
        goto LAB_007b6c32;
      }
      uVar1 = pDVar5->index;
      uVar2 = pDVar7->index;
      if ((dd->perm[uVar1] < dd->perm[uVar2]) || (uVar2 == uVar1)) {
        pDVar5 = (pDVar5->type).kids.T;
        if (uVar1 == uVar2) goto LAB_007b6bef;
        bVar3 = false;
      }
      else {
        bVar4 = false;
LAB_007b6bef:
        pDVar7 = (pDVar7->type).kids.T;
      }
    } while ((bool)(bVar3 | bVar4));
  }
  return 0;
}

Assistant:

int Extra_bddSuppCheckContainment( DdManager * dd, DdNode * bL, DdNode * bH, DdNode ** bLarge, DdNode ** bSmall )
{
    DdNode * bSL = bL;
    DdNode * bSH = bH;
    int fLcontainsH = 1;
    int fHcontainsL = 1;
    int TopVar;
    
    if ( bSL == bSH )
        return 0;

    while ( bSL != b1 || bSH != b1 )
    {
        if ( bSL == b1 )
        { // Low component has no vars; High components has some vars
            fLcontainsH = 0;
            if ( fHcontainsL == 0 )
                return 0;
            else
                break;
        }

        if ( bSH == b1 )
        { // similarly
            fHcontainsL = 0;
            if ( fLcontainsH == 0 )
                return 0;
            else
                break;
        }

        // determine the topmost var of the supports by comparing their levels
        if ( dd->perm[bSL->index] < dd->perm[bSH->index] )
            TopVar = bSL->index;
        else
            TopVar = bSH->index;

        if ( TopVar == bSL->index && TopVar == bSH->index ) 
        { // they are on the same level
            // it does not tell us anything about their containment
            // skip this var
            bSL = cuddT(bSL);
            bSH = cuddT(bSH);
        }
        else if ( TopVar == bSL->index ) // and TopVar != bSH->index
        { // Low components is higher and contains more vars
            // it is not possible that High component contains Low
            fHcontainsL = 0;
            // skip this var
            bSL = cuddT(bSL);
        }
        else // if ( TopVar == bSH->index ) // and TopVar != bSL->index
        { // similarly
            fLcontainsH = 0;
            // skip this var
            bSH = cuddT(bSH);
        }

        // check the stopping condition
        if ( !fHcontainsL && !fLcontainsH )
            return 0;
    }
    // only one of them can be true at the same time
    assert( !fHcontainsL || !fLcontainsH );
    if ( fHcontainsL )
    {
        *bLarge = bH;
        *bSmall = bL;
    }
    else // fLcontainsH
    {
        *bLarge = bL;
        *bSmall = bH;
    }
    return 1;
}